

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> __thiscall
duckdb::PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator>::
GetTargetMemoryStream
          (PrimitiveDictionary<duckdb::double_na_equal,_double,_duckdb::FloatingPointOperator> *this
          )

{
  uchar *puVar1;
  ulong uVar2;
  MemoryStream *this_00;
  pointer pMVar3;
  pointer *__ptr;
  
  puVar1 = (uchar *)duckdb::MemoryStream::GetData();
  uVar2 = duckdb::MemoryStream::GetCapacity();
  this_00 = (MemoryStream *)operator_new(0x30);
  duckdb::MemoryStream::MemoryStream(this_00,puVar1,uVar2);
  this->allocator = (Allocator *)this_00;
  pMVar3 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
           operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                       *)this);
  duckdb::MemoryStream::GetPosition();
  duckdb::MemoryStream::SetPosition((ulong)pMVar3);
  return (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
         (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)this;
}

Assistant:

unique_ptr<MemoryStream> GetTargetMemoryStream() const {
		auto result = make_uniq<MemoryStream>(target_stream.GetData(), target_stream.GetCapacity());
		result->SetPosition(target_stream.GetPosition());
		return result;
	}